

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O3

ByteString * OSSL::oid2ByteString(ByteString *__return_storage_ptr__,int nid)

{
  int iVar1;
  ASN1_PRINTABLESTRING *str;
  char *pcVar2;
  string name;
  uchar *p;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  uchar *local_28;
  
  ByteString::ByteString(__return_storage_ptr__);
  local_40 = 0;
  local_38[0] = 0;
  if (nid < 0x43f) {
    if (nid == 0x40a) {
      pcVar2 = "curve25519";
    }
    else {
      if (nid != 0x40b) {
        return __return_storage_ptr__;
      }
      pcVar2 = "curve448";
    }
  }
  else if (nid == 0x440) {
    pcVar2 = "edwards448";
  }
  else {
    if (nid != 0x43f) {
      return __return_storage_ptr__;
    }
    pcVar2 = "edwards25519";
  }
  local_48 = local_38;
  std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,(ulong)pcVar2);
  str = ASN1_PRINTABLESTRING_new();
  ASN1_STRING_set(str,local_48,(int)local_40);
  iVar1 = i2d_ASN1_PRINTABLESTRING(str,(uchar **)0x0);
  ByteString::resize(__return_storage_ptr__,(long)iVar1);
  local_28 = ByteString::operator[](__return_storage_ptr__,0);
  i2d_ASN1_PRINTABLESTRING(str,&local_28);
  ASN1_PRINTABLESTRING_free(str);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteString OSSL::oid2ByteString(int nid)
{
	ByteString rv;
	std::string name;

	switch (nid)
	{
		case EVP_PKEY_ED25519:
			name = "edwards25519";
			break;

		case EVP_PKEY_X25519:
			name = "curve25519";
			break;

		case EVP_PKEY_ED448:
			name = "edwards448";
			break;

		case EVP_PKEY_X448:
			name = "curve448";
			break;

		default:
			return rv;
	}

	ASN1_PRINTABLESTRING *str = ASN1_PRINTABLESTRING_new();
	ASN1_STRING_set(str, name.c_str(), name.length());
	rv.resize(i2d_ASN1_PRINTABLESTRING(str, NULL));
	unsigned char *p = &rv[0];
	i2d_ASN1_PRINTABLESTRING(str, &p);
	ASN1_PRINTABLESTRING_free(str);

	return rv;
}